

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_compute_color_stats
               (LodePNGColorStats *stats,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType colortype;
  uint uVar1;
  uchar a_00;
  LodePNGColorStats *pLVar2;
  LodePNGColorMode *mode;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  undefined8 in_R10;
  undefined7 uVar9;
  size_t i;
  byte bVar10;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_11a;
  unsigned_short local_118;
  unsigned_short local_116;
  unsigned_short local_114;
  byte local_111;
  uint local_110;
  uint local_10c;
  uchar local_107;
  byte local_106;
  byte local_105;
  uint local_104;
  LodePNGColorStats *local_100;
  size_t local_f8;
  LodePNGColorMode *local_f0;
  uchar *local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  size_t local_d0;
  uint local_c8;
  uint local_c4;
  size_t local_c0;
  ColorTree local_b8;
  
  local_f8 = (ulong)h * (ulong)w;
  colortype = mode_in->colortype;
  local_e8 = in;
  uVar4 = lodepng_can_have_alpha(mode_in);
  uVar6 = mode_in->bitdepth;
  local_f0 = mode_in;
  local_d4 = getNumColorChannels(colortype);
  local_d4 = local_d4 * uVar6;
  uVar6 = stats->bits;
  local_d0 = CONCAT71(local_d0._1_7_,local_d4 == 1 && uVar6 == 1);
  local_c8 = 0x101;
  if ((local_d4 < 9) &&
     (local_c8 = (1 << ((byte)local_d4 & 0x1f)) + stats->numcolors, 0x100 < local_c8)) {
    local_c8 = 0x101;
  }
  local_10c = CONCAT31(local_10c._1_3_,(colortype & ~LCT_GREY_ALPHA) == LCT_GREY);
  stats->numpixels = stats->numpixels + local_f8;
  bVar16 = stats->allow_palette == 0;
  local_b8.children[0xe] = (ColorTree *)0x0;
  local_b8.children[0xf] = (ColorTree *)0x0;
  local_b8.children[0xc] = (ColorTree *)0x0;
  local_b8.children[0xd] = (ColorTree *)0x0;
  local_b8.children[10] = (ColorTree *)0x0;
  local_b8.children[0xb] = (ColorTree *)0x0;
  local_b8.children[8] = (ColorTree *)0x0;
  local_b8.children[9] = (ColorTree *)0x0;
  local_b8.children[6] = (ColorTree *)0x0;
  local_b8.children[7] = (ColorTree *)0x0;
  local_b8.children[4] = (ColorTree *)0x0;
  local_b8.children[5] = (ColorTree *)0x0;
  local_b8.children[2] = (ColorTree *)0x0;
  local_b8.children[3] = (ColorTree *)0x0;
  local_b8.children[0] = (ColorTree *)0x0;
  local_b8.children[1] = (ColorTree *)0x0;
  local_b8.index = -1;
  local_110 = 1;
  if (stats->alpha == 0) {
    local_110 = uVar4 ^ 1;
  }
  uVar4 = stats->colored;
  bVar13 = local_d4 <= uVar6;
  bVar14 = local_c8 <= stats->numcolors;
  local_104 = 0;
  bVar15 = (uVar6 == 0x10 || bVar16) || bVar14;
  if (((uVar6 != 0x10 && !bVar16) && !bVar14) && (stats->numcolors != 0)) {
    uVar12 = 0;
    do {
      local_104 = color_tree_add(&local_b8,stats->palette[uVar12 * 4],stats->palette[uVar12 * 4 + 1]
                                 ,stats->palette[uVar12 * 4 + 2],stats->palette[uVar12 * 4 + 3],
                                 (uint)uVar12);
      uVar6 = local_104;
      if (local_104 != 0) goto LAB_0011f6ba;
      uVar12 = uVar12 + 1;
    } while (uVar12 < stats->numcolors);
  }
  bVar7 = (byte)local_10c | uVar4 != 0;
  bVar8 = bVar13 | (byte)local_d0;
  bVar16 = true;
  local_100 = stats;
  if (local_f0->bitdepth == 0x10) {
    local_116 = 0;
    local_118 = 0;
    local_11a = 0;
    local_114 = 0;
    bVar16 = local_f8 == 0;
    if (!bVar16) {
      local_10c = CONCAT31(local_10c._1_3_,bVar7);
      getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,0,local_f0);
      stats = local_100;
      if ((local_116 & 0xff) == local_116 >> 8) {
        sVar11 = 1;
        do {
          if ((((local_118 & 0xff) != local_118 >> 8) || ((local_11a & 0xff) != local_11a >> 8)) ||
             ((local_114 & 0xff) != local_114 >> 8)) break;
          bVar16 = local_f8 == sVar11;
          if (bVar16) goto LAB_0011efc8;
          getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,sVar11,local_f0);
          sVar11 = sVar11 + 1;
        } while ((local_116 & 0xff) == local_116 >> 8);
      }
      stats->bits = 0x10;
      bVar8 = 1;
      bVar15 = true;
LAB_0011efc8:
      bVar7 = (byte)local_10c;
    }
  }
  if (bVar16) {
    local_116 = local_116 & 0xff00;
    local_118 = local_118 & 0xff00;
    local_11a = local_11a & 0xff00;
    local_114 = local_114 & 0xff00;
    if (local_f8 != 0) {
      local_10c = (uint)bVar7;
      local_c0 = local_f8 - 1;
      sVar11 = 0;
      do {
        uVar6 = local_d4;
        getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_118,(uchar *)&local_11a,
                           (uchar *)&local_114,local_e8,sVar11,local_f0);
        if ((bVar8 == 0) && (stats->bits < 8)) {
          uVar4 = 1;
          if (1 < (byte)((byte)local_116 + 1)) {
            uVar4 = 8;
            if ((uint)(byte)local_116 * -0xf0f0f0f < 0xf0f0f10) {
              uVar4 = (uint)(0x3030303 < (uint)(byte)local_116 * -0x3030303) * 2 + 2;
            }
          }
          if (stats->bits < uVar4) {
            stats->bits = uVar4;
          }
        }
        uVar4 = stats->bits;
        uVar12 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
        bVar16 = local_10c == 0;
        local_10c = 1;
        bVar3 = (byte)local_118;
        bVar7 = (byte)local_11a;
        if (bVar16) {
          if ((byte)local_116 == (byte)local_118) {
            uVar12 = 0;
            local_10c = 0;
            if ((byte)local_116 == (byte)local_11a) goto LAB_0011f0f6;
          }
          stats->colored = 1;
          uVar9 = (undefined7)(uVar12 >> 8);
          uVar12 = CONCAT71(uVar9,1);
          local_10c = 1;
          if (uVar4 < 8) {
            stats->bits = 8;
            uVar12 = CONCAT71(uVar9,1);
          }
        }
LAB_0011f0f6:
        a_00 = (uchar)local_114;
        if (local_110 == 0) {
          if ((stats->key_r == (local_116 & 0xff)) && (stats->key_g == (local_118 & 0xff))) {
            bVar16 = stats->key_b == (local_11a & 0xff);
          }
          else {
            bVar16 = false;
          }
          if ((uchar)local_114 == 0xff) {
            bVar10 = 0;
            local_110 = 0;
            if ((bool)(stats->key != 0 & bVar16)) {
              stats->alpha = 1;
              stats->key = 0;
              uVar1 = stats->bits;
              goto joined_r0x0011f309;
            }
          }
          else {
            if (((uchar)local_114 != '\0') || (!(bool)(stats->key == 0 | bVar16))) {
              stats->alpha = 1;
              stats->key = 0;
              uVar1 = stats->bits;
joined_r0x0011f309:
              if (uVar1 < 8) {
                stats->bits = 8;
              }
              goto LAB_0011f101;
            }
            local_110 = 0;
            if ((stats->alpha == 0) && (stats->key == 0)) {
              stats->key = 1;
              stats->key_r = local_116 & 0xff;
              stats->key_g = local_118 & 0xff;
              stats->key_b = local_11a & 0xff;
              bVar10 = 0;
              local_110 = 0;
            }
            else {
              bVar10 = 0;
            }
          }
        }
        else {
LAB_0011f101:
          bVar10 = 1;
          local_110 = 1;
        }
        local_d0 = sVar11;
        if (bVar15) {
          bVar15 = true;
          bVar8 = uVar6 <= uVar4;
        }
        else {
          local_106 = (byte)local_116;
          local_105 = (byte)local_118;
          local_c4 = (uint)(byte)local_116;
          local_dc = (uint)uVar12;
          local_111 = uVar6 <= uVar4;
          local_d8 = uVar4;
          iVar5 = color_tree_get(&local_b8,(byte)local_116,(byte)local_118,(byte)local_11a,
                                 (uchar)local_114);
          pLVar2 = local_100;
          uVar12 = (ulong)local_dc;
          bVar15 = false;
          uVar4 = local_d8;
          bVar8 = local_111;
          if (iVar5 < 0) {
            local_107 = a_00;
            local_104 = CONCAT31(local_104._1_3_,bVar7);
            uVar6 = color_tree_add(&local_b8,(uchar)local_c4,bVar3,bVar7,a_00,local_100->numcolors);
            if (uVar6 != 0) goto LAB_0011f6ba;
            uVar6 = pLVar2->numcolors;
            if ((ulong)uVar6 < 0x100) {
              uVar12 = (ulong)(uVar6 * 4);
              pLVar2->palette[(ulong)uVar6 * 4] = local_106;
              pLVar2->palette[uVar12 + 1] = local_105;
              pLVar2->palette[uVar12 + 2] = (uchar)local_104;
              pLVar2->palette[uVar12 + 3] = local_107;
            }
            pLVar2->numcolors = uVar6 + 1;
            bVar15 = local_c8 <= uVar6 + 1;
            local_104 = 0;
            uVar12 = (ulong)local_dc;
            uVar4 = local_d8;
            bVar8 = local_111;
          }
        }
        bVar7 = (byte)uVar12 & bVar10 & bVar15;
        in_R10 = CONCAT71((int7)(uVar12 >> 8),bVar7);
        stats = local_100;
      } while (((bVar7 & local_d4 <= uVar4) == 0) && (sVar11 = local_d0 + 1, local_c0 != local_d0));
    }
    if ((stats->key != 0) && (local_f8 != 0 && stats->alpha == 0)) {
      sVar11 = 0;
      do {
        getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_118,(uchar *)&local_11a,
                           (uchar *)&local_114,local_e8,sVar11,local_f0);
        if (((((uchar)local_114 != '\0') && (stats->key_r == (local_116 & 0xff))) &&
            (stats->key_g == (local_118 & 0xff))) && (stats->key_b == (local_11a & 0xff))) {
          stats->alpha = 1;
          stats->key = 0;
          if (stats->bits < 8) {
            stats->bits = 8;
          }
        }
        sVar11 = sVar11 + 1;
      } while (local_f8 != sVar11);
    }
    iVar5._0_2_ = stats->key_r;
    iVar5._2_2_ = stats->key_g;
    stats->key_r = (short)(iVar5 << 8) + (undefined2)iVar5;
    stats->key_g = stats->key_g * 0x101;
    stats->key_b = (short)(*(int *)&stats->key_b << 8) + (short)*(int *)&stats->key_b;
    uVar6 = local_104;
  }
  else {
    local_116 = 0;
    local_118 = 0;
    local_11a = 0;
    local_114 = 0;
    if (local_f8 != 0) {
      sVar11 = local_f8 - 1;
      i = 0;
      do {
        getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,i,local_f0);
        bVar3 = 1;
        bVar16 = bVar7 == 0;
        bVar7 = 1;
        if (bVar16) {
          if (local_116 == local_118) {
            bVar3 = 0;
            bVar7 = 0;
            if (local_116 == local_11a) goto LAB_0011f3f9;
          }
          stats->colored = 1;
          bVar3 = 1;
          bVar7 = 1;
        }
LAB_0011f3f9:
        if (local_110 == 0) {
          if ((local_116 == stats->key_r) && (local_118 == stats->key_g)) {
            bVar16 = local_11a == stats->key_b;
          }
          else {
            bVar16 = false;
          }
          if (local_114 == 0xffff) {
            bVar10 = 0;
            local_110 = 0;
            if ((bool)(stats->key != 0 & bVar16)) goto LAB_0011f49f;
          }
          else {
            if ((local_114 != 0) || (stats->key != 0 && !bVar16)) {
LAB_0011f49f:
              stats->alpha = 1;
              stats->key = 0;
              goto LAB_0011f4b1;
            }
            if ((stats->alpha == 0) && (stats->key == 0)) {
              stats->key = 1;
              stats->key_r = local_116;
              stats->key_g = local_118;
              stats->key_b = local_11a;
              bVar10 = 0;
              local_110 = 0;
            }
            else {
              bVar10 = 0;
              local_110 = 0;
            }
          }
        }
        else {
LAB_0011f4b1:
          bVar10 = 1;
          local_110 = 1;
        }
      } while (((bVar3 & bVar10 & bVar15 & bVar8 != 0) == 0) &&
              (bVar16 = sVar11 != i, i = i + 1, bVar16));
    }
    mode = local_f0;
    uVar6 = local_104;
    if ((stats->key != 0) && (local_f8 != 0 && local_100->alpha == 0)) {
      sVar11 = 0;
      do {
        getPixelColorRGBA16(&local_116,&local_118,&local_11a,&local_114,local_e8,sVar11,mode);
        if ((((local_114 != 0) && (local_116 == local_100->key_r)) &&
            (local_118 == local_100->key_g)) && (local_11a == local_100->key_b)) {
          local_100->alpha = 1;
          local_100->key = 0;
        }
        sVar11 = sVar11 + 1;
        uVar6 = local_104;
      } while (local_f8 != sVar11);
    }
  }
LAB_0011f6ba:
  local_104 = uVar6;
  color_tree_cleanup(&local_b8);
  return local_104;
}

Assistant:

unsigned lodepng_compute_color_stats(LodePNGColorStats* stats,
                                     const unsigned char* in, unsigned w, unsigned h,
                                     const LodePNGColorMode* mode_in) {
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;
  unsigned error = 0;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (stats->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, stats->numcolors + (1u << bpp));

  stats->numpixels += numpixels;

  /*if palette not allowed, no need to compute numcolors*/
  if(!stats->allow_palette) numcolors_done = 1;

  color_tree_init(&tree);

  /*If the stats was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(stats->alpha) alpha_done = 1;
  if(stats->colored) colored_done = 1;
  if(stats->bits == 16) numcolors_done = 1;
  if(stats->bits >= bpp) bits_done = 1;
  if(stats->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done) {
    for(i = 0; i < stats->numcolors; i++) {
      const unsigned char* color = &stats->palette[i * 4];
      error = color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
      if(error) goto cleanup;
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/ {
        stats->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen) {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 65535 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 65535 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
        }
      }
    }
  } else /* < 16-bit */ {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i) {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && stats->bits < 8) {
        /*only r is checked, < 8 bits is only relevant for grayscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > stats->bits) stats->bits = bits;
      }
      bits_done = (stats->bits >= bpp);

      if(!colored_done && (r != g || r != b)) {
        stats->colored = 1;
        colored_done = 1;
        if(stats->bits < 8) stats->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done) {
        unsigned matchkey = (r == stats->key_r && g == stats->key_g && b == stats->key_b);
        if(a != 255 && (a != 0 || (stats->key && !matchkey))) {
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        } else if(a == 0 && !stats->alpha && !stats->key) {
          stats->key = 1;
          stats->key_r = r;
          stats->key_g = g;
          stats->key_b = b;
        } else if(a == 255 && stats->key && matchkey) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done) {
        if(!color_tree_has(&tree, r, g, b, a)) {
          error = color_tree_add(&tree, r, g, b, a, stats->numcolors);
          if(error) goto cleanup;
          if(stats->numcolors < 256) {
            unsigned char* p = stats->palette;
            unsigned n = stats->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++stats->numcolors;
          numcolors_done = stats->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(stats->key && !stats->alpha) {
      for(i = 0; i != numpixels; ++i) {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == stats->key_r && g == stats->key_g && b == stats->key_b) {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          stats->alpha = 1;
          stats->key = 0;
          alpha_done = 1;
          if(stats->bits < 8) stats->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the stats's key always 16-bit for consistency - repeat each byte twice*/
    stats->key_r += (stats->key_r << 8);
    stats->key_g += (stats->key_g << 8);
    stats->key_b += (stats->key_b << 8);
  }

cleanup:
  color_tree_cleanup(&tree);
  return error;
}